

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall cmSearchPath::AddCMakePrefixPath(cmSearchPath *this,string *variable)

{
  char *__s;
  string *psVar1;
  allocator<char> local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  string local_28;
  
  if (this->FC != (cmFindCommon *)0x0) {
    __s = cmMakefile::GetDefinition((this->FC->super_cmCommand).Makefile,variable);
    if (__s != (char *)0x0) {
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expanded.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,__s,&local_49);
      cmSystemTools::ExpandListArgument(&local_28,&expanded,false);
      std::__cxx11::string::~string((string *)&local_28);
      psVar1 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((this->FC->super_cmCommand).Makefile);
      AddPrefixPaths(this,&expanded,(psVar1->_M_dataplus)._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expanded);
    }
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSearchPath.cxx"
                ,0x66,"void cmSearchPath::AddCMakePrefixPath(const std::string &)");
}

Assistant:

void cmSearchPath::AddCMakePrefixPath(const std::string& variable)
{
  assert(this->FC != nullptr);

  // Get a path from a CMake variable.
  if (const char* value = this->FC->Makefile->GetDefinition(variable)) {
    std::vector<std::string> expanded;
    cmSystemTools::ExpandListArgument(value, expanded);

    this->AddPrefixPaths(
      expanded, this->FC->Makefile->GetCurrentSourceDirectory().c_str());
  }
}